

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O1

FT_Error af_latin_hints_detect_features
                   (AF_GlyphHints hints,FT_UInt width_count,AF_WidthRec *widths,AF_Dimension dim)

{
  AF_Edge *ppAVar1;
  AF_Edge *ppAVar2;
  FT_Bool top_to_bottom_hinting;
  char cVar3;
  byte bVar4;
  short sVar5;
  AF_StyleMetrics_conflict pAVar6;
  FT_Memory memory;
  AF_ScriptClass pAVar7;
  FT_Long b_;
  AF_Segment pAVar8;
  AF_Edge *ppAVar9;
  FT_Error FVar10;
  ulong uVar11;
  FT_Long FVar12;
  FT_Long FVar13;
  long lVar14;
  FT_Long FVar15;
  long lVar16;
  ulong uVar17;
  AF_Edge_conflict pAVar18;
  AF_Edge_conflict pAVar19;
  uint uVar20;
  AF_Segment_conflict pAVar21;
  AF_Segment pAVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  long lVar26;
  AF_Edge_conflict pAVar27;
  uint uVar28;
  uint uVar29;
  AF_Segment_conflict pAVar30;
  AF_Segment_conflict pAVar31;
  AF_Segment *ppAVar32;
  bool bVar33;
  AF_Edge_conflict local_38;
  
  FVar10 = af_latin_hints_compute_segments(hints,dim);
  if (FVar10 == 0) {
    af_latin_hints_link_segments(hints,width_count,widths,dim);
    uVar11 = (ulong)dim;
    pAVar6 = hints->metrics;
    pAVar30 = hints->axis[uVar11].segments;
    if (pAVar30 == (AF_Segment_conflict)0x0) {
      pAVar31 = (AF_Segment_conflict)0x0;
    }
    else {
      pAVar31 = pAVar30 + hints->axis[uVar11].num_segments;
    }
    memory = hints->memory;
    pAVar7 = af_script_classes[pAVar6->style_class->script];
    hints->axis[uVar11].num_edges = 0;
    if (dim == AF_DIMENSION_VERT) {
      top_to_bottom_hinting = pAVar7->top_to_bottom_hinting;
    }
    else {
      top_to_bottom_hinting = '\0';
    }
    b_ = *(FT_Long *)
          ((long)hints->axis[0].embedded.segments + (ulong)(dim != AF_DIMENSION_HORZ) * 0x10 + -0x68
          );
    if (dim == AF_DIMENSION_HORZ) {
      FVar12 = FT_DivFix(0x40,hints->y_scale);
    }
    else {
      FVar12 = 0;
    }
    FVar13 = FT_DivFix(0x20,b_);
    lVar14 = (long)*(int *)((long)pAVar6 + uVar11 * 0x4c90 + 0x1e8) * (long)(int)b_;
    iVar25 = (int)((ulong)(lVar14 + (lVar14 >> 0x3f) + 0x8000) >> 0x10);
    iVar23 = 0x10;
    if (iVar25 < 0x10) {
      iVar23 = iVar25;
    }
    FVar15 = FT_DivFix((long)iVar23,b_);
    FVar10 = 0;
    if (pAVar30 < pAVar31) {
      lVar14 = FVar12 * 3;
      FVar10 = 0;
      pAVar21 = pAVar30;
      do {
        lVar16 = (long)pAVar21->height;
        bVar33 = false;
        if ((FVar12 <= lVar16) && (pAVar21->delta <= FVar13)) {
          cVar3 = pAVar21->dir;
          if ((cVar3 != AF_DIR_NONE) &&
             ((pAVar21->serif == (AF_Segment)0x0 ||
              (lVar14 == lVar16 * 2 || SBORROW8(lVar14,lVar16 * 2) != lVar14 + lVar16 * -2 < 0)))) {
            uVar17 = (ulong)hints->axis[uVar11].num_edges;
            if (uVar17 == 0) {
              pAVar27 = (AF_Edge_conflict)0x0;
            }
            else {
              pAVar18 = hints->axis[uVar11].edges;
              uVar24 = 1;
              pAVar27 = (AF_Edge_conflict)0x0;
              do {
                lVar26 = (long)pAVar21->pos - (long)pAVar18->fpos;
                lVar16 = -lVar26;
                if (0 < lVar26) {
                  lVar16 = lVar26;
                }
                if ((lVar16 < FVar15) && (pAVar18->dir == cVar3)) {
                  bVar33 = false;
                  pAVar27 = pAVar18;
                }
                else {
                  bVar33 = true;
                }
                if (uVar17 <= uVar24) break;
                uVar24 = uVar24 + 1;
                pAVar18 = pAVar18 + 1;
              } while (bVar33);
            }
            if (pAVar27 == (AF_Edge_conflict)0x0) {
              FVar10 = af_axis_hints_new_edge
                                 (hints->axis + uVar11,(int)pAVar21->pos,(int)cVar3,
                                  top_to_bottom_hinting,memory,&local_38);
              bVar33 = true;
              if (FVar10 != 0) goto LAB_0027092b;
              *(undefined8 *)&local_38->score = 0;
              local_38->first = (AF_Segment)0x0;
              local_38->link = (AF_Edge)0x0;
              local_38->serif = (AF_Edge)0x0;
              local_38->scale = 0;
              local_38->blue_edge = (AF_Width)0x0;
              local_38->pos = 0;
              local_38->flags = '\0';
              local_38->dir = '\0';
              *(undefined6 *)&local_38->field_0x1a = 0;
              *(undefined8 *)local_38 = 0;
              local_38->opos = 0;
              local_38->first = pAVar21;
              local_38->last = pAVar21;
              local_38->dir = pAVar21->dir;
              sVar5 = pAVar21->pos;
              local_38->fpos = sVar5;
              lVar16 = (long)sVar5 * (long)(int)b_;
              lVar16 = lVar16 + (lVar16 >> 0x3f) + 0x8000 >> 0x10;
              local_38->opos = lVar16;
              local_38->pos = lVar16;
              pAVar21->edge_next = pAVar21;
            }
            else {
              pAVar21->edge_next = pAVar27->first;
              pAVar27->last->edge_next = pAVar21;
              pAVar27->last = pAVar21;
            }
            bVar33 = false;
          }
        }
LAB_0027092b:
        if (bVar33) {
          return FVar10;
        }
        pAVar21 = pAVar21 + 1;
      } while (pAVar21 < pAVar31);
    }
    for (; pAVar30 < pAVar31; pAVar30 = pAVar30 + 1) {
      if (pAVar30->dir == '\x04') {
        uVar17 = (ulong)hints->axis[uVar11].num_edges;
        if (uVar17 == 0) {
          pAVar27 = (AF_Edge_conflict)0x0;
        }
        else {
          pAVar18 = hints->axis[uVar11].edges;
          uVar24 = 1;
          pAVar27 = (AF_Edge_conflict)0x0;
          do {
            lVar16 = (long)pAVar30->pos - (long)pAVar18->fpos;
            lVar14 = -lVar16;
            if (0 < lVar16) {
              lVar14 = lVar16;
            }
            if (lVar14 < FVar15) {
              pAVar27 = pAVar18;
            }
            if (uVar17 <= uVar24) break;
            pAVar18 = pAVar18 + 1;
            uVar24 = uVar24 + 1;
          } while (FVar15 <= lVar14);
        }
        if (pAVar27 != (AF_Edge_conflict)0x0) {
          pAVar30->edge_next = pAVar27->first;
          pAVar27->last->edge_next = pAVar30;
          pAVar27->last = pAVar30;
        }
      }
    }
    pAVar27 = hints->axis[uVar11].edges;
    if (pAVar27 == (AF_Edge_conflict)0x0) {
      pAVar18 = (AF_Edge_conflict)0x0;
    }
    else {
      pAVar18 = pAVar27 + hints->axis[uVar11].num_edges;
    }
    pAVar19 = pAVar27;
    if (pAVar27 < pAVar18) {
      do {
        pAVar8 = pAVar19->first;
        pAVar22 = pAVar8;
        if (pAVar8 != (AF_Segment)0x0) {
          do {
            pAVar22->edge = pAVar19;
            ppAVar32 = &pAVar22->edge_next;
            pAVar22 = *ppAVar32;
          } while (*ppAVar32 != pAVar8);
        }
        pAVar19 = pAVar19 + 1;
      } while (pAVar19 < pAVar18);
      for (; pAVar27 < pAVar18; pAVar27 = pAVar27 + 1) {
        pAVar8 = pAVar27->first;
        ppAVar1 = &pAVar27->link;
        ppAVar2 = &pAVar27->serif;
        iVar23 = 0;
        iVar25 = 0;
        pAVar22 = pAVar8;
        do {
          if ((pAVar22->serif == (AF_Segment)0x0) ||
             (pAVar19 = pAVar22->serif->edge, pAVar19 == (AF_Edge_conflict)0x0)) {
            bVar33 = false;
          }
          else {
            bVar33 = pAVar19 != pAVar27;
          }
          bVar4 = pAVar22->flags;
          if (pAVar22->link == (AF_Segment)0x0) {
            if (bVar33) goto LAB_00270ac8;
          }
          else if ((bVar33) || (pAVar22->link->edge != (AF_Edge_conflict)0x0)) {
LAB_00270ac8:
            ppAVar32 = &pAVar22->serif;
            ppAVar9 = ppAVar2;
            if (!bVar33) {
              ppAVar32 = &pAVar22->link;
              ppAVar9 = ppAVar1;
            }
            pAVar19 = *ppAVar9;
            if (pAVar19 == (AF_Edge_conflict)0x0) {
LAB_00270b26:
              pAVar19 = (*ppAVar32)->edge;
            }
            else {
              uVar28 = (int)pAVar27->fpos - (int)pAVar19->fpos;
              uVar20 = -uVar28;
              if (0 < (int)uVar28) {
                uVar20 = uVar28;
              }
              uVar29 = (int)pAVar22->pos - (int)(*ppAVar32)->pos;
              uVar28 = -uVar29;
              if (0 < (int)uVar29) {
                uVar28 = uVar29;
              }
              if ((uVar28 & 0xffff) < (uVar20 & 0xffff)) goto LAB_00270b26;
            }
            if (bVar33) {
              *ppAVar2 = pAVar19;
              pAVar19->flags = pAVar19->flags | 2;
            }
            else {
              *ppAVar1 = pAVar19;
            }
          }
          uVar20 = bVar4 & 1;
          iVar23 = iVar23 + uVar20;
          iVar25 = iVar25 + (uint)(byte)((byte)uVar20 ^ 1);
          pAVar22 = pAVar22->edge_next;
        } while (pAVar22 != pAVar8);
        pAVar27->flags = iVar25 <= iVar23 && 0 < iVar23;
        if ((pAVar27->serif != (AF_Edge)0x0) && (*ppAVar1 != (AF_Edge)0x0)) {
          *ppAVar2 = (AF_Edge)0x0;
        }
      }
    }
  }
  return FVar10;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_latin_hints_detect_features( AF_GlyphHints  hints,
                                  FT_UInt        width_count,
                                  AF_WidthRec*   widths,
                                  AF_Dimension   dim )
  {
    FT_Error  error;


    error = af_latin_hints_compute_segments( hints, dim );
    if ( !error )
    {
      af_latin_hints_link_segments( hints, width_count, widths, dim );

      error = af_latin_hints_compute_edges( hints, dim );
    }

    return error;
  }